

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV AsymSignFinal(Session *session,CK_BYTE_PTR pSignature,CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  Session *this;
  ulong *in_RDX;
  ByteString *in_RSI;
  Session *in_RDI;
  ByteString signature;
  CK_ULONG size;
  PrivateKey *privateKey;
  AsymmetricAlgorithm *asymCrypto;
  Session *in_stack_ffffffffffffff70;
  undefined1 local_60 [40];
  ulong local_38;
  PrivateKey *local_30;
  AsymmetricAlgorithm *local_28;
  ulong *local_20;
  ByteString *local_18;
  Session *local_10;
  CK_RV local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = Session::getAsymmetricCryptoOp(in_RDI);
  local_30 = Session::getPrivateKey(local_10);
  if ((local_28 == (AsymmetricAlgorithm *)0x0) || (local_30 == (PrivateKey *)0x0)) {
    Session::resetOp(in_stack_ffffffffffffff70);
    local_8 = 0x91;
  }
  else {
    bVar1 = Session::getReAuthentication(local_10);
    if (bVar1) {
      Session::resetOp(in_stack_ffffffffffffff70);
      local_8 = 0x101;
    }
    else {
      iVar2 = (*(local_30->super_Serialisable)._vptr_Serialisable[5])();
      local_38 = CONCAT44(extraout_var,iVar2);
      if (local_18 == (ByteString *)0x0) {
        *local_20 = local_38;
        local_8 = 0;
      }
      else if (*local_20 < local_38) {
        *local_20 = local_38;
        local_8 = 0x150;
      }
      else {
        ByteString::ByteString((ByteString *)0x170fa4);
        uVar3 = (*local_28->_vptr_AsymmetricAlgorithm[5])(local_28,local_60);
        if ((uVar3 & 1) == 0) {
          Session::resetOp(in_stack_ffffffffffffff70);
          local_8 = 5;
        }
        else {
          sVar4 = ByteString::size((ByteString *)0x171016);
          if (sVar4 == local_38) {
            this = (Session *)ByteString::byte_str(local_18);
            memcpy(local_18,this,local_38);
            *local_20 = local_38;
            Session::resetOp(this);
            local_8 = 0;
          }
          else {
            softHSMLog(3,"AsymSignFinal",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x12f2,"The size of the signature differs from the size of the mechanism");
            Session::resetOp(in_stack_ffffffffffffff70);
            local_8 = 5;
          }
        }
        ByteString::~ByteString((ByteString *)0x1710e0);
      }
    }
  }
  return local_8;
}

Assistant:

static CK_RV AsymSignFinal(Session* session, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	AsymmetricAlgorithm* asymCrypto = session->getAsymmetricCryptoOp();
	PrivateKey* privateKey = session->getPrivateKey();
	if (asymCrypto == NULL || privateKey == NULL)
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check if re-authentication is required
	if (session->getReAuthentication())
	{
		session->resetOp();
		return CKR_USER_NOT_LOGGED_IN;
	}

	// Size of the signature
	CK_ULONG size = privateKey->getOutputLength();
	if (pSignature == NULL_PTR)
	{
		*pulSignatureLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulSignatureLen < size)
	{
		*pulSignatureLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the signature
	ByteString signature;
	if (!asymCrypto->signFinal(signature))
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (signature.size() != size)
	{
		ERROR_MSG("The size of the signature differs from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pSignature, signature.byte_str(), size);
	*pulSignatureLen = size;

	session->resetOp();
	return CKR_OK;
}